

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall
plot::BrailleCanvas::ellipse
          (BrailleCanvas *this,Color *stroke_color,Color *fill_color,Rect rct,TerminalOp op)

{
  Rect rct_00;
  Rect rct_01;
  Rect rct_02;
  Rect rct_03;
  Rect rct_04;
  Rect rct_05;
  Rect rct_06;
  Rect rct_07;
  BrailleCanvas *pBVar1;
  anon_class_32_4_b873ab05 local_358;
  GenericPoint<long> local_338;
  GenericRect<long> local_328;
  anon_class_32_4_b873ab04 local_308;
  GenericPoint<long> local_2e8;
  GenericPoint<long> local_2d8;
  GenericRect<long> local_2c8;
  anon_class_32_4_b873ab05 local_2a8;
  GenericPoint<long> local_288;
  GenericPoint<long> local_278;
  GenericRect<long> local_268;
  anon_class_32_4_b873ab04 local_248;
  GenericPoint<long> local_228;
  GenericRect<long> local_218;
  anon_class_32_4_b873ab05 local_1f8;
  GenericPoint<long> local_1d8;
  GenericRect<long> local_1c8;
  anon_class_32_4_b873ab04 local_1a8;
  GenericPoint<long> local_188;
  GenericPoint<long> local_178;
  GenericRect<long> local_168;
  anon_class_32_4_b873ab05 local_148;
  GenericPoint<long> local_128;
  GenericPoint<long> local_118;
  GenericRect<long> local_108;
  anon_class_32_4_b873ab04 local_e8;
  GenericPoint<long> local_c8;
  GenericRect<long> local_b8;
  long local_98;
  Coord cy;
  Coord cx;
  Coord y_fac;
  undefined1 local_78 [4];
  float x_fac;
  GenericPoint<long> local_68;
  undefined1 local_58 [8];
  GenericPoint<long> size_;
  long local_40;
  long local_38;
  long local_30;
  TerminalOp op_local;
  Color *fill_color_local;
  Color *stroke_color_local;
  BrailleCanvas *this_local;
  
  GenericRect<long>::sorted((GenericRect<long> *)&size_.y,&rct);
  rct.p1.x = size_.y;
  rct.p1.y = local_40;
  rct.p2.x = local_38;
  rct.p2.y = local_30;
  local_68 = GenericRect<long>::size(&rct);
  GenericPoint<long>::GenericPoint((GenericPoint<long> *)local_78,1,1);
  _local_58 = operator+(&local_68,(GenericPoint<long> *)local_78);
  y_fac._4_4_ = 2.0 / (float)(long)local_58;
  cx = size_.x / 2 - (ulong)((size_.x % 2 != 0 ^ 0xffU) & 1);
  cy = (rct.p1.x + (long)local_58 / 2) - (ulong)(((long)local_58 % 2 != 0 ^ 0xffU) & 1);
  local_98 = rct.p1.y + cx;
  pBVar1 = push(this);
  GenericPoint<long>::GenericPoint(&local_c8,cy,local_98);
  GenericRect<long>::GenericRect(&local_b8,&rct.p1,&local_c8);
  local_e8.x_fac = y_fac._4_4_;
  local_e8.y_fac = cx;
  local_e8.cy = local_98;
  local_e8.x0 = rct.p1.x;
  rct_00.p1.y = local_b8.p1.y;
  rct_00.p1.x = local_b8.p1.x;
  rct_00.p2.x = local_b8.p2.x;
  rct_00.p2.y = local_b8.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (pBVar1,stroke_color,rct_00,&local_e8,Over);
  GenericPoint<long>::GenericPoint(&local_118,cy + 1,rct.p1.y);
  GenericPoint<long>::GenericPoint(&local_128,rct.p2.x,local_98);
  GenericRect<long>::GenericRect(&local_108,&local_118,&local_128);
  local_148.x_fac = y_fac._4_4_;
  local_148.y_fac = cx;
  local_148.cy = local_98;
  local_148.x1 = rct.p2.x;
  rct_01.p1.y = local_108.p1.y;
  rct_01.p1.x = local_108.p1.x;
  rct_01.p2.x = local_108.p2.x;
  rct_01.p2.y = local_108.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_2_>
                     (pBVar1,stroke_color,rct_01,&local_148,Over);
  GenericPoint<long>::GenericPoint(&local_178,rct.p1.x,local_98 + 1);
  GenericPoint<long>::GenericPoint(&local_188,cy,rct.p2.y);
  GenericRect<long>::GenericRect(&local_168,&local_178,&local_188);
  local_1a8.x_fac = y_fac._4_4_;
  local_1a8.y_fac = cx;
  local_1a8.cy = local_98;
  local_1a8.x0 = rct.p1.x;
  rct_02.p1.y = local_168.p1.y;
  rct_02.p1.x = local_168.p1.x;
  rct_02.p2.x = local_168.p2.x;
  rct_02.p2.y = local_168.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_3_>
                     (pBVar1,stroke_color,rct_02,&local_1a8,Over);
  GenericPoint<long>::GenericPoint(&local_1d8,cy + 1,local_98 + 1);
  GenericRect<long>::GenericRect(&local_1c8,&local_1d8,&rct.p2);
  local_1f8.x_fac = y_fac._4_4_;
  local_1f8.y_fac = cx;
  local_1f8.cy = local_98;
  local_1f8.x1 = rct.p2.x;
  rct_03.p1.y = local_1c8.p1.y;
  rct_03.p1.x = local_1c8.p1.x;
  rct_03.p2.x = local_1c8.p2.x;
  rct_03.p2.y = local_1c8.p2.y;
  pBVar1 = stroke<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(long)_4_>
                     (pBVar1,stroke_color,rct_03,&local_1f8,Over);
  GenericPoint<long>::GenericPoint(&local_228,cy,local_98);
  GenericRect<long>::GenericRect(&local_218,&rct.p1,&local_228);
  local_248.x_fac = y_fac._4_4_;
  local_248.y_fac = cx;
  local_248.cy = local_98;
  local_248.x0 = rct.p1.x;
  rct_04.p1.y = local_218.p1.y;
  rct_04.p1.x = local_218.p1.x;
  rct_04.p2.x = local_218.p2.x;
  rct_04.p2.y = local_218.p2.y;
  pBVar1 = fill<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(plot::GenericPoint<long>)_1_>
                     (pBVar1,fill_color,rct_04,&local_248,Over);
  GenericPoint<long>::GenericPoint(&local_278,cy + 1,rct.p1.y);
  GenericPoint<long>::GenericPoint(&local_288,rct.p2.x,local_98);
  GenericRect<long>::GenericRect(&local_268,&local_278,&local_288);
  local_2a8.x_fac = y_fac._4_4_;
  local_2a8.y_fac = cx;
  local_2a8.cy = local_98;
  local_2a8.x1 = rct.p2.x;
  rct_05.p1.y = local_268.p1.y;
  rct_05.p1.x = local_268.p1.x;
  rct_05.p2.x = local_268.p2.x;
  rct_05.p2.y = local_268.p2.y;
  pBVar1 = fill<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(plot::GenericPoint<long>)_2_>
                     (pBVar1,fill_color,rct_05,&local_2a8,Over);
  GenericPoint<long>::GenericPoint(&local_2d8,rct.p1.x,local_98 + 1);
  GenericPoint<long>::GenericPoint(&local_2e8,cy,rct.p2.y);
  GenericRect<long>::GenericRect(&local_2c8,&local_2d8,&local_2e8);
  local_308.x_fac = y_fac._4_4_;
  local_308.y_fac = cx;
  local_308.cy = local_98;
  local_308.x0 = rct.p1.x;
  rct_06.p1.y = local_2c8.p1.y;
  rct_06.p1.x = local_2c8.p1.x;
  rct_06.p2.x = local_2c8.p2.x;
  rct_06.p2.y = local_2c8.p2.y;
  pBVar1 = fill<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(plot::GenericPoint<long>)_3_>
                     (pBVar1,fill_color,rct_06,&local_308,Over);
  GenericPoint<long>::GenericPoint(&local_338,cy + 1,local_98 + 1);
  GenericRect<long>::GenericRect(&local_328,&local_338,&rct.p2);
  local_358.x_fac = y_fac._4_4_;
  local_358.y_fac = cx;
  local_358.cy = local_98;
  local_358.x1 = rct.p2.x;
  rct_07.p1.y = local_328.p1.y;
  rct_07.p1.x = local_328.p1.x;
  rct_07.p2.x = local_328.p2.x;
  rct_07.p2.y = local_328.p2.y;
  pBVar1 = fill<plot::BrailleCanvas::ellipse(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(plot::GenericPoint<long>)_4_>
                     (pBVar1,fill_color,rct_07,&local_358,Over);
  pBVar1 = pop(pBVar1,op);
  return pBVar1;
}

Assistant:

BrailleCanvas& ellipse(Color const& stroke_color, Color const& fill_color, Rect rct, TerminalOp op = TerminalOp::Over) {
        rct = rct.sorted();
        auto size_ = rct.size() + Point(1, 1);

        float x_fac = 2.0f/size_.x;
        Coord y_fac = size_.y/2 - (!(size_.y % 2)),
              cx = rct.p1.x + (size_.x/cell_cols) - (!(size_.x % cell_cols)),
              cy = rct.p1.y + y_fac;

        return push()
              .stroke(stroke_color, { rct.p1, { cx, cy } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(stroke_color, { { cx + 1, rct.p1.y }, { rct.p2.x, cy } }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((x1 - x + 1) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy - std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(stroke_color, { { rct.p1.x, cy + 1 }, { cx, rct.p2.y } }, [x_fac,y_fac,cy,x0=rct.p1.x](Coord x) {
                  auto x_over_a = ((x - x0) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x - x0) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .stroke(stroke_color, { { cx + 1, cy + 1 }, rct.p2 }, [x_fac,y_fac,cy,x1=rct.p2.x](Coord x) {
                  auto x_over_a = ((x1 - x) * x_fac) - 1.0f,
                       next_x_over_a = ((1 + x1 - x) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a)),
                        end_ = cy + std::lround(y_fac*std::sqrt(1 - next_x_over_a*next_x_over_a));
                  return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
              }, TerminalOp::Over)
              .fill(fill_color, { rct.p1, { cx, cy } }, [x_fac,y_fac,cy,x0=rct.p1.x](Point p) {
                  auto x_over_a = ((p.x - x0) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a));
                  return p.y > base;
              }, TerminalOp::Over)
              .fill(fill_color, { { cx + 1, rct.p1.y }, { rct.p2.x, cy } }, [x_fac,y_fac,cy,x1=rct.p2.x](Point p) {
                  auto x_over_a = ((x1 - p.x) * x_fac) - 1.0f;
                  Coord base = cy - std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a));
                  return p.y > base;
              }, TerminalOp::Over)
              .fill(fill_color, { { rct.p1.x, cy + 1 }, { cx, rct.p2.y } }, [x_fac,y_fac,cy,x0=rct.p1.x](Point p) {
                  auto x_over_a = ((p.x - x0) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a));
                  return p.y < base;
              }, TerminalOp::Over)
              .fill(fill_color, { { cx + 1, cy + 1 }, rct.p2 }, [x_fac,y_fac,cy,x1=rct.p2.x](Point p) {
                  auto x_over_a = ((x1 - p.x) * x_fac) - 1.0f;
                  Coord base = cy + std::lround(y_fac*std::sqrt(1 - x_over_a*x_over_a));
                  return p.y < base;
              }, TerminalOp::Over)
              .pop(op);
    }